

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O1

void lqGetBinPopulationStats(lqInternalDB *lq,int *min,int *max,float *average)

{
  uint uVar1;
  int iVar2;
  lqClientProxy *plVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  int iVar9;
  
  uVar1 = lq->divy * lq->divx * lq->divz;
  if ((int)uVar1 < 1) {
    fVar8 = NAN;
    iVar2 = 0x7fffffff;
    iVar4 = 0;
  }
  else {
    iVar7 = 0;
    iVar9 = 0;
    uVar5 = 0;
    iVar2 = 0x7fffffff;
    iVar4 = 0;
    do {
      plVar3 = lq->bins[uVar5];
      iVar6 = 0;
      if (plVar3 != (lqClientProxy *)0x0) {
        iVar6 = 0;
        do {
          iVar6 = iVar6 + 1;
          plVar3 = plVar3->next;
        } while (plVar3 != (lqClientProxy *)0x0);
      }
      if (0 < iVar6) {
        if (iVar4 <= iVar6) {
          iVar4 = iVar6;
        }
        if (iVar6 <= iVar2) {
          iVar2 = iVar6;
        }
        iVar7 = iVar7 + iVar6;
        iVar9 = iVar9 + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar1);
    fVar8 = (float)iVar7 / (float)iVar9;
  }
  *min = iVar2;
  *max = iVar4;
  *average = fVar8;
  return;
}

Assistant:

void lqGetBinPopulationStats (lqInternalDB* lq,
                              int* min,
                              int* max,
                              float* average)
{
    int minPop = INT_MAX;
    int maxPop = 0;
    int totalCount = 0;
    int nonEmptyBinCount = 0;
    int bincount = lq->divx * lq->divy * lq->divz;
    int i;

    for (i=0; i<bincount; i++)
    {
        /* clear the counter */
        int objectCount = 0;

        /* apply counting function to each object in bin[i] */
	lqMapOverAllObjectsInBin (lq->bins[i], lqgbpsCounter, &objectCount);

        /* collect data: max and min population, count objects and non-empty bins */
        if (objectCount > 0)
        {
            nonEmptyBinCount++;
            if (maxPop < objectCount) maxPop = objectCount;
            if (minPop > objectCount) minPop = objectCount;
            totalCount += objectCount;
        }
    }

    /* set return values */
    *min = minPop;
    *max = maxPop;
    *average = ((float) totalCount) / ((float) nonEmptyBinCount);
}